

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

void Supp_ManStop(Supp_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = p->vMemory;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      if (pVVar1->pArray[lVar2] != (void *)0x0) {
        free(pVVar1->pArray[lVar2]);
      }
      lVar2 = lVar2 + 1;
      pVVar1 = p->vMemory;
    } while (lVar2 < pVVar1->nSize);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vFree;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Supp_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Supp_ManStop( Supp_Man_t * p )
{
    void * pMemory;
    int i;
    Vec_PtrForEachEntry( void *, p->vMemory, pMemory, i )
        ABC_FREE( pMemory );
    Vec_PtrFree( p->vMemory );
    Vec_PtrFree( p->vFree );
    ABC_FREE( p );
}